

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::PushRepetition
          (ParseState *this,int min,int max,StringPiece *s,bool nongreedy)

{
  bool bVar1;
  RegexpOp op;
  int iVar2;
  Regexp *pRVar3;
  Regexp **ppRVar4;
  StringPiece *in_RCX;
  int in_EDX;
  int in_ESI;
  ParseState *in_RDI;
  byte in_R8B;
  RepetitionWalker w;
  Regexp *re;
  ParseFlags fl;
  Regexp *in_stack_00000148;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ParseState *in_stack_ffffffffffffff88;
  Regexp local_58;
  Regexp *local_30;
  ParseFlags local_28;
  byte local_21;
  StringPiece *local_20;
  int local_18;
  int local_14;
  byte local_1;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  if ((((in_EDX == -1) || (in_ESI <= in_EDX)) && (in_ESI < 0x3e9)) && (in_EDX < 0x3e9)) {
    if (in_RDI->stacktop_ != (Regexp *)0x0) {
      local_18 = in_EDX;
      local_14 = in_ESI;
      op = Regexp::op(in_RDI->stacktop_);
      bVar1 = IsMarker(in_RDI,op);
      if (!bVar1) {
        local_28 = in_RDI->flags_;
        if ((local_21 & 1) != 0) {
          local_28 = operator^(local_28,NonGreedy);
        }
        pRVar3 = (Regexp *)operator_new(0x28);
        Regexp((Regexp *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (RegexpOp)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (ParseFlags)in_stack_ffffffffffffff78);
        (pRVar3->field_7).field_0.min_ = local_14;
        (pRVar3->field_7).field_0.max_ = local_18;
        local_30 = pRVar3;
        AllocSub((Regexp *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        local_30->down_ = in_RDI->stacktop_->down_;
        pRVar3 = FinishRegexp(in_stack_ffffffffffffff88,
                              (Regexp *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        ppRVar4 = Regexp::sub(local_30);
        *ppRVar4 = pRVar3;
        bVar1 = ComputeSimple(in_stack_00000148);
        local_30->simple_ = bVar1;
        in_RDI->stacktop_ = local_30;
        if ((1 < local_14) || (1 < local_18)) {
          pRVar3 = &local_58;
          RepetitionWalker::RepetitionWalker
                    ((RepetitionWalker *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          iVar2 = Walker<int>::Walk((Walker<int> *)
                                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                    pRVar3,0);
          if (iVar2 == 0) {
            RegexpStatus::set_code(in_RDI->status_,kRegexpRepeatSize);
            RegexpStatus::set_error_arg(in_RDI->status_,local_20);
            local_1 = 0;
          }
          RepetitionWalker::~RepetitionWalker((RepetitionWalker *)0x253af0);
          if (iVar2 == 0) goto LAB_00253b06;
        }
        local_1 = 1;
        goto LAB_00253b06;
      }
    }
    RegexpStatus::set_code(in_RDI->status_,kRegexpRepeatArgument);
    RegexpStatus::set_error_arg(in_RDI->status_,local_20);
    local_1 = 0;
  }
  else {
    RegexpStatus::set_code(in_RDI->status_,kRegexpRepeatSize);
    RegexpStatus::set_error_arg(in_RDI->status_,local_20);
    local_1 = 0;
  }
LAB_00253b06:
  return (bool)(local_1 & 1);
}

Assistant:

bool Regexp::ParseState::PushRepetition(int min, int max,
                                        const StringPiece& s,
                                        bool nongreedy) {
  if ((max != -1 && max < min) || min > kMaxRepeat || max > kMaxRepeat) {
    status_->set_code(kRegexpRepeatSize);
    status_->set_error_arg(s);
    return false;
  }
  if (stacktop_ == NULL || IsMarker(stacktop_->op())) {
    status_->set_code(kRegexpRepeatArgument);
    status_->set_error_arg(s);
    return false;
  }
  Regexp::ParseFlags fl = flags_;
  if (nongreedy)
    fl = fl ^ NonGreedy;
  Regexp* re = new Regexp(kRegexpRepeat, fl);
  re->min_ = min;
  re->max_ = max;
  re->AllocSub(1);
  re->down_ = stacktop_->down_;
  re->sub()[0] = FinishRegexp(stacktop_);
  re->simple_ = re->ComputeSimple();
  stacktop_ = re;
  if (min >= 2 || max >= 2) {
    RepetitionWalker w;
    if (w.Walk(stacktop_, kMaxRepeat) == 0) {
      status_->set_code(kRegexpRepeatSize);
      status_->set_error_arg(s);
      return false;
    }
  }
  return true;
}